

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroll_widgets.cpp
# Opt level: O1

void draw_down_arrow(int left,int top,int width,int height,Am_Widget_Look look,bool depressed,
                    bool active,bool option,Computed_Colors_Record *color_rec,Am_Drawonable *draw)

{
  uint uVar1;
  uint uVar2;
  Am_Style *prev;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  am_rect arrow_rect;
  am_rect arrow_rect_00;
  Am_Style fill1;
  Am_Style line2;
  Am_Style line1;
  
  uVar3 = (ulong)(uint)top;
  arrow_rect_00.top = top;
  arrow_rect_00.left = left;
  arrow_rect_00.height = height;
  arrow_rect_00.width = width;
  if (look.value == Am_MACINTOSH_LOOK_val) {
    if (active) {
      if (depressed) {
        prev = &Am_Black;
      }
      else {
        prev = &color_rec->data->background_style;
      }
    }
    else {
      prev = &color_rec->data->foreground_style;
    }
    Am_Style::Am_Style(&fill1,prev);
    draw_mac_arrow_box(arrow_rect_00,active,color_rec,draw);
    uVar2 = top + 7;
    uVar3 = (ulong)uVar2;
    (*draw->_vptr_Am_Drawonable[0x2b])
              (draw,&color_rec->data->shadow_style,&fill1,(ulong)(left + 2),uVar3,
               (ulong)(left + 0xc),uVar3,(ulong)(left + 7),(ulong)(top + 0xc),(ulong)(left + 2),
               uVar3,0);
    (*draw->_vptr_Am_Drawonable[0x2b])
              (draw,&color_rec->data->shadow_style,&fill1,(ulong)(left + 5U),(ulong)uVar2,
               (ulong)(left + 5U),(ulong)(top + 3),(ulong)(left + 9),(ulong)(top + 3),
               (ulong)(left + 9),uVar3,0);
    (*draw->_vptr_Am_Drawonable[0x28])
              (draw,&fill1,(ulong)(left + 6),uVar3,(ulong)(left + 8),(ulong)uVar2,0);
  }
  else {
    if (look.value == Am_WINDOWS_LOOK_val) {
      arrow_rect.width = width;
      arrow_rect.height = height;
      arrow_rect.left = left;
      arrow_rect.top = top;
      draw_win_arrow_box(arrow_rect,depressed,option,color_rec,draw);
      uVar2 = height - 0x10U >> 1;
      iVar4 = 0;
      if (height < 0x11) {
        uVar2 = 0;
      }
      uVar6 = (uint)depressed + left + 10;
      do {
        uVar1 = uVar2 + top + (uint)depressed + 6 + iVar4;
        (*draw->_vptr_Am_Drawonable[0x28])
                  (draw,&Am_Black,(ulong)(iVar4 + left + (uint)depressed + 4),(ulong)uVar1,
                   (ulong)uVar6,(ulong)uVar1,0);
        iVar4 = iVar4 + 1;
        uVar6 = uVar6 - 1;
      } while (iVar4 != 4);
      return;
    }
    if (look.value != Am_MOTIF_LOOK_val) {
      Am_Error("Unknown Look parameter");
    }
    Am_Style::Am_Style(&fill1,&color_rec->data->foreground_style + depressed);
    Am_Style::Am_Style(&line1,&color_rec->data->shadow_style + !depressed);
    Am_Style::Am_Style(&line2,&color_rec->data->shadow_style + depressed);
    uVar2 = width / 2 + left;
    uVar5 = (ulong)((left + width) - 1);
    uVar6 = height + -1 + top;
    (*draw->_vptr_Am_Drawonable[0x2a])
              (draw,&line1,&Am_No_Style,(ulong)uVar2,(ulong)uVar6,(ulong)(left + 1),uVar3,uVar5,
               uVar3,0);
    (*draw->_vptr_Am_Drawonable[0x28])(draw,&line2,uVar5,uVar3,(ulong)uVar2,(ulong)uVar6,0);
    uVar3 = (ulong)((height + top) - 2);
    uVar7 = (ulong)(top + 1);
    uVar5 = (ulong)((width + left) - 2);
    (*draw->_vptr_Am_Drawonable[0x2a])
              (draw,&line1,&fill1,(ulong)uVar2,uVar3,(ulong)(left + 2),uVar7,uVar5,uVar7,0);
    (*draw->_vptr_Am_Drawonable[0x28])(draw,&line2,uVar5,uVar7,(ulong)uVar2,uVar3,0);
    Am_Style::~Am_Style(&line2);
    Am_Style::~Am_Style(&line1);
  }
  Am_Style::~Am_Style(&fill1);
  return;
}

Assistant:

void
draw_down_arrow(int left, int top, int width, int height, Am_Widget_Look look,
                bool depressed, bool active, bool option,
                const Computed_Colors_Record &color_rec, Am_Drawonable *draw)
{
  am_rect arrow_rect(left, top, width, height);
  switch (look.value) {
  case Am_MOTIF_LOOK_val: {
    const Am_Style fill1(depressed ? color_rec.data->background_style
                                   : color_rec.data->foreground_style);
    const Am_Style line1(depressed ? color_rec.data->shadow_style
                                   : color_rec.data->highlight_style);
    const Am_Style line2(depressed ? color_rec.data->highlight_style
                                   : color_rec.data->shadow_style);

    int center_x = left + width / 2;
    int right = left + width - 1;
    int bottom = top + height - 1;

    //left line
    draw->Draw_2_Lines(line1, Am_No_Style, center_x, bottom, left + 1, top,
                       right, top);
    //right line
    draw->Draw_Line(line2, right, top, center_x, bottom);
    //left line
    draw->Draw_2_Lines(line1, fill1, center_x, bottom - 1, left + 2, top + 1,
                       right - 1, top + 1);
    //right line
    draw->Draw_Line(line2, right - 1, top + 1, center_x, bottom - 1);
    break;
  }

  case Am_WINDOWS_LOOK_val: {
    draw_win_arrow_box(arrow_rect, depressed, option, color_rec, draw);

    int a_top = !depressed ? 6 : 7, a_left = !depressed ? 4 : 5,
        a_width = 6, // 7 - 1, because extra pixel is drawn at end of line
        a_height = 4;

    if (height > 16) // so that the option button arrow draw correctly
      a_top += (height - 16) / 2;

    for (int y = 0; y < a_height; y++) {
      draw->Draw_Line(Am_Black, left + a_left, top + a_top + y,
                      left + a_left + a_width, top + a_top + y);
      a_left++;
      a_width -= 2;
    }
    break;
  }

  case Am_MACINTOSH_LOOK_val: {
    Am_Style fill_style =
        (active) ? (!depressed ? color_rec.data->background_style : Am_Black)
                 : color_rec.data->foreground_style;

    draw_mac_arrow_box(arrow_rect, active, color_rec, draw);
    draw->Draw_3_Lines(color_rec.data->shadow_style, fill_style, left + 2,
                       top + 7, left + 12, top + 7, left + 7, top + 12,
                       left + 2, top + 7);
    draw->Draw_3_Lines(color_rec.data->shadow_style, fill_style, left + 5,
                       top + 7, left + 5, top + 3, left + 9, top + 3, left + 9,
                       top + 7);
    draw->Draw_Line(fill_style, left + 6, top + 7, left + 8, top + 7);
    break;
  }

  default:
    Am_Error("Unknown Look parameter");
    break;
  }
}